

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

void av1_cnn_deconvolve_c
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride)

{
  PADDING_TYPE PVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  CNN_LAYER_CONFIG *in_R8;
  long in_R9;
  int in_stack_00000008;
  int jj_2;
  int ii_2;
  int w_2;
  int m_2;
  int h_2;
  int l_2;
  int off_2;
  int k_2;
  float sum_2;
  int v_2;
  int u_2;
  int i_2;
  int jj_1;
  int ii_1;
  int w_1;
  int m_1;
  int h_1;
  int l_1;
  int off_1;
  int k_1;
  float sum_1;
  int v_1;
  int u_1;
  int i_1;
  int jj;
  int ii;
  int w;
  int m;
  int h;
  int l;
  int off;
  int k;
  float sum;
  int v;
  int u;
  int i;
  int out_height;
  int out_width;
  int cstep;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_b8;
  int local_b0;
  int local_ac;
  int local_a8;
  float local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_88;
  int local_80;
  int local_7c;
  int local_78;
  float local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_58;
  int local_50;
  int local_4c;
  int local_48;
  float local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  CNN_LAYER_CONFIG *local_20;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_2c = in_R8->in_channels * in_R8->out_channels;
  local_30 = 0;
  local_34 = 0;
  local_28 = in_R9;
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  av1_find_cnn_layer_output_size(in_ESI,in_EDX,in_R8,&local_30,&local_34);
  PVar1 = local_20->pad;
  if (PVar1 == '\0') {
    for (local_38 = 0; local_38 < local_20->out_channels; local_38 = local_38 + 1) {
      for (local_3c = 0; local_3c < local_34; local_3c = local_3c + 1) {
        for (local_40 = 0; local_40 < local_30; local_40 = local_40 + 1) {
          local_44 = local_20->bias[local_38];
          for (local_48 = 0; local_48 < local_20->in_channels; local_48 = local_48 + 1) {
            local_4c = local_48 * local_20->out_channels + local_38;
            for (local_50 = 0; local_50 < local_20->filter_height; local_50 = local_50 + 1) {
              iVar3 = get_start_shift_deconvolve(local_20->filter_height,local_20->skip_height);
              iVar3 = (local_3c - local_50) + iVar3;
              for (local_58 = 0; local_58 < local_20->filter_width; local_58 = local_58 + 1) {
                iVar4 = get_start_shift_deconvolve(local_20->filter_width,local_20->skip_width);
                iVar4 = (local_40 - local_58) + iVar4;
                if ((iVar3 % local_20->skip_height == 0) && (iVar4 % local_20->skip_width == 0)) {
                  iVar2 = iVar3 / local_20->skip_height;
                  iVar4 = iVar4 / local_20->skip_width;
                  if ((-1 < iVar2) && (((iVar2 < local_10 && (-1 < iVar4)) && (iVar4 < local_c)))) {
                    local_44 = local_20->weights[local_4c] *
                               *(float *)(*(long *)(local_8 + (long)local_48 * 8) +
                                         (long)(iVar2 * local_14 + iVar4) * 4) + local_44;
                  }
                }
                local_4c = local_2c + local_4c;
              }
            }
          }
          *(float *)(*(long *)(local_28 + (long)local_38 * 8) +
                    (long)(local_3c * in_stack_00000008 + local_40) * 4) = local_44;
        }
      }
    }
  }
  else if (PVar1 == '\x01') {
    for (local_68 = 0; local_68 < local_20->out_channels; local_68 = local_68 + 1) {
      for (local_6c = 0; local_6c < local_34; local_6c = local_6c + 1) {
        for (local_70 = 0; local_70 < local_30; local_70 = local_70 + 1) {
          local_74 = local_20->bias[local_68];
          for (local_78 = 0; local_78 < local_20->in_channels; local_78 = local_78 + 1) {
            local_7c = local_78 * local_20->out_channels + local_68;
            for (local_80 = 0; local_80 < local_20->filter_height; local_80 = local_80 + 1) {
              iVar3 = get_start_shift_deconvolve(local_20->filter_height,local_20->skip_height);
              iVar3 = (local_6c - local_80) + iVar3;
              for (local_88 = 0; local_88 < local_20->filter_width; local_88 = local_88 + 1) {
                local_e8 = get_start_shift_deconvolve(local_20->filter_width,local_20->skip_width);
                local_e8 = (local_70 - local_88) + local_e8;
                if ((iVar3 % local_20->skip_height == 0) && (local_e8 % local_20->skip_width == 0))
                {
                  if (iVar3 / local_20->skip_height < 0) {
                    local_dc = 0;
                  }
                  else {
                    if (iVar3 / local_20->skip_height < local_10) {
                      local_e0 = iVar3 / local_20->skip_height;
                    }
                    else {
                      local_e0 = local_10 + -1;
                    }
                    local_dc = local_e0;
                  }
                  if (local_e8 / local_20->skip_width < 0) {
                    local_e4 = 0;
                  }
                  else {
                    if (local_e8 / local_20->skip_width < local_c) {
                      local_e8 = local_e8 / local_20->skip_width;
                    }
                    else {
                      local_e8 = local_c + -1;
                    }
                    local_e4 = local_e8;
                  }
                  local_74 = local_20->weights[local_7c] *
                             *(float *)(*(long *)(local_8 + (long)local_78 * 8) +
                                       (long)(local_dc * local_14 + local_e4) * 4) + local_74;
                }
                local_7c = local_2c + local_7c;
              }
            }
          }
          *(float *)(*(long *)(local_28 + (long)local_68 * 8) +
                    (long)(local_6c * in_stack_00000008 + local_70) * 4) = local_74;
        }
      }
    }
  }
  else if (PVar1 == '\x02') {
    for (local_98 = 0; local_98 < local_20->out_channels; local_98 = local_98 + 1) {
      for (local_9c = 0; local_9c < local_34; local_9c = local_9c + 1) {
        for (local_a0 = 0; local_a0 < local_30; local_a0 = local_a0 + 1) {
          local_a4 = local_20->bias[local_98];
          for (local_a8 = 0; local_a8 < local_20->in_channels; local_a8 = local_a8 + 1) {
            local_ac = local_a8 * local_20->out_channels + local_98;
            for (local_b0 = 0; local_b0 < local_20->filter_height; local_b0 = local_b0 + 1) {
              for (local_b8 = 0; local_b8 < local_20->filter_width; local_b8 = local_b8 + 1) {
                if (((local_9c - local_b0) % local_20->skip_height == 0) &&
                   ((local_a0 - local_b8) % local_20->skip_width == 0)) {
                  iVar3 = (local_9c - local_b0) / local_20->skip_height;
                  iVar4 = (local_a0 - local_b8) / local_20->skip_width;
                  if ((-1 < iVar3) && (((iVar3 < local_10 && (-1 < iVar4)) && (iVar4 < local_c)))) {
                    local_a4 = local_20->weights[local_ac] *
                               *(float *)(*(long *)(local_8 + (long)local_a8 * 8) +
                                         (long)(iVar3 * local_14 + iVar4) * 4) + local_a4;
                  }
                }
                local_ac = local_2c + local_ac;
              }
            }
          }
          *(float *)(*(long *)(local_28 + (long)local_98 * 8) +
                    (long)(local_9c * in_stack_00000008 + local_a0) * 4) = local_a4;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_cnn_deconvolve_c(const float **input, int in_width, int in_height,
                          int in_stride, const CNN_LAYER_CONFIG *layer_config,
                          float **output, int out_stride) {
  assert(layer_config->deconvolve);

  const int cstep = layer_config->in_channels * layer_config->out_channels;

  int out_width = 0;
  int out_height = 0;
  av1_find_cnn_layer_output_size(in_width, in_height, layer_config, &out_width,
                                 &out_height);
  switch (layer_config->pad) {
    case PADDING_SAME_ZERO:
      for (int i = 0; i < layer_config->out_channels; ++i) {
        for (int u = 0; u < out_height; ++u) {
          for (int v = 0; v < out_width; ++v) {
            float sum = layer_config->bias[i];
            for (int k = 0; k < layer_config->in_channels; ++k) {
              int off = k * layer_config->out_channels + i;
              for (int l = 0; l < layer_config->filter_height; ++l) {
                const int h =
                    u - l +
                    get_start_shift_deconvolve(layer_config->filter_height,
                                               layer_config->skip_height);
                for (int m = 0; m < layer_config->filter_width;
                     ++m, off += cstep) {
                  const int w =
                      v - m +
                      get_start_shift_deconvolve(layer_config->filter_width,
                                                 layer_config->skip_width);
                  if ((h % layer_config->skip_height) != 0 ||
                      (w % layer_config->skip_width) != 0)
                    continue;
                  const int ii = h / layer_config->skip_height;
                  const int jj = w / layer_config->skip_width;
                  if (ii < 0 || ii >= in_height || jj < 0 || jj >= in_width)
                    continue;
                  sum += layer_config->weights[off] *
                         input[k][ii * in_stride + jj];
                }
              }
            }
            output[i][u * out_stride + v] = sum;
          }
        }
      }
      break;
    case PADDING_SAME_REPLICATE:
      for (int i = 0; i < layer_config->out_channels; ++i) {
        for (int u = 0; u < out_height; ++u) {
          for (int v = 0; v < out_width; ++v) {
            float sum = layer_config->bias[i];
            for (int k = 0; k < layer_config->in_channels; ++k) {
              int off = k * layer_config->out_channels + i;
              for (int l = 0; l < layer_config->filter_height; ++l) {
                const int h =
                    u - l +
                    get_start_shift_deconvolve(layer_config->filter_height,
                                               layer_config->skip_height);
                for (int m = 0; m < layer_config->filter_width;
                     ++m, off += cstep) {
                  const int w =
                      v - m +
                      get_start_shift_deconvolve(layer_config->filter_width,
                                                 layer_config->skip_width);
                  if ((h % layer_config->skip_height) != 0 ||
                      (w % layer_config->skip_width) != 0)
                    continue;
                  const int ii =
                      CLAMPINDEX(h / layer_config->skip_height, in_height);
                  const int jj =
                      CLAMPINDEX(w / layer_config->skip_width, in_width);
                  assert(ii >= 0 && ii < in_height && jj >= 0 && jj < in_width);
                  sum += layer_config->weights[off] *
                         input[k][ii * in_stride + jj];
                }
              }
            }
            output[i][u * out_stride + v] = sum;
          }
        }
      }
      break;
    case PADDING_VALID:
      for (int i = 0; i < layer_config->out_channels; ++i) {
        for (int u = 0; u < out_height; ++u) {
          for (int v = 0; v < out_width; ++v) {
            float sum = layer_config->bias[i];
            for (int k = 0; k < layer_config->in_channels; ++k) {
              int off = k * layer_config->out_channels + i;
              for (int l = 0; l < layer_config->filter_height; ++l) {
                const int h = u - l;
                for (int m = 0; m < layer_config->filter_width;
                     ++m, off += cstep) {
                  const int w = v - m;
                  if ((h % layer_config->skip_height) != 0 ||
                      (w % layer_config->skip_width) != 0)
                    continue;
                  const int ii = h / layer_config->skip_height;
                  const int jj = w / layer_config->skip_width;
                  if (ii < 0 || ii >= in_height || jj < 0 || jj >= in_width)
                    continue;
                  sum += layer_config->weights[off] *
                         input[k][ii * in_stride + jj];
                }
              }
            }
            output[i][u * out_stride + v] = sum;
          }
        }
      }
      break;
    default: assert(0 && "Unknown padding type");
  }
}